

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O2

astcenc_error
astcenc_decompress_image
          (astcenc_context *ctxo,uint8_t *data,size_t data_len,astcenc_image *image_outp,
          astcenc_swizzle *swizzle,uint thread_index)

{
  atomic<unsigned_int> *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  astcenc_error aVar6;
  uint uVar7;
  uint count;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint xpos;
  uint ypos;
  uint uVar12;
  uint zpos;
  undefined1 auVar13 [16];
  symbolic_compressed_block scb;
  image_block blk;
  symbolic_compressed_block local_1100;
  image_block local_1080;
  
  uVar7 = (ctxo->context).thread_count;
  if (thread_index < uVar7) {
    auVar13._8_4_ = 7;
    auVar13._0_8_ = 0x700000007;
    auVar13._12_4_ = 7;
    auVar13 = vpmaxud_avx((undefined1  [16])*swizzle,auVar13);
    auVar13 = vpcmpeqd_avx((undefined1  [16])*swizzle,auVar13);
    if ((((auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar13 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar13[0xf]) {
      uVar2 = (ctxo->context).config.block_x;
      uVar3 = (ctxo->context).config.block_y;
      uVar4 = (ctxo->context).config.block_z;
      uVar12 = ((image_outp->dim_x + uVar2) - 1) / uVar2;
      uVar10 = ((uVar3 + image_outp->dim_y) - 1) / uVar3;
      uVar11 = uVar10 * uVar12;
      uVar9 = (((image_outp->dim_z + uVar4) - 1) / uVar4) * uVar11;
      if (data_len < uVar9 * 0x10) {
        aVar6 = ASTCENC_ERR_OUT_OF_MEM;
      }
      else {
        memset(&local_1080,0,0x1020);
        local_1080.texel_count = (char)uVar3 * (char)uVar2 * (char)uVar4;
        local_1080.decode_unorm8 = image_outp->data_type == ASTCENC_TYPE_U8;
        if (uVar7 == 1) {
          ParallelManager::reset(&ctxo->manage_decompress);
        }
        ParallelManager::init(&ctxo->manage_decompress,(EVP_PKEY_CTX *)(ulong)uVar9);
        while( true ) {
          LOCK();
          paVar1 = &(ctxo->manage_decompress).m_start_count;
          uVar7 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
          (paVar1->super___atomic_base<unsigned_int>)._M_i =
               (paVar1->super___atomic_base<unsigned_int>)._M_i + 0x80;
          UNLOCK();
          if ((((ctxo->manage_decompress).m_is_cancelled._M_base._M_i & 1U) != 0) ||
             (uVar9 = (ctxo->manage_decompress).m_task_count, count = uVar9 - uVar7,
             uVar9 < uVar7 || count == 0)) break;
          if (0x7f < count) {
            count = 0x80;
          }
          uVar9 = count + uVar7;
          for (; uVar7 < uVar9; uVar7 = uVar7 + 1) {
            iVar5 = (int)(((ulong)uVar7 % (ulong)uVar11) / (ulong)uVar12);
            iVar8 = (int)(((ulong)uVar7 % (ulong)uVar11) % (ulong)uVar12);
            physical_to_symbolic
                      ((ctxo->context).bsd,
                       data + (((uVar7 / uVar11) * uVar10 + iVar5) * uVar12 + iVar8) * 0x10,
                       &local_1100);
            xpos = iVar8 * uVar2;
            ypos = iVar5 * uVar3;
            zpos = (uVar7 / uVar11) * uVar4;
            decompress_symbolic_block
                      ((ctxo->context).config.profile,(ctxo->context).bsd,xpos,ypos,zpos,&local_1100
                       ,&local_1080);
            store_image_block(image_outp,&local_1080,(ctxo->context).bsd,xpos,ypos,zpos,swizzle);
          }
          ParallelManager::complete_task_assignment(&ctxo->manage_decompress,count);
        }
        aVar6 = ASTCENC_SUCCESS;
      }
    }
    else {
      aVar6 = ASTCENC_ERR_BAD_SWIZZLE;
    }
  }
  else {
    aVar6 = ASTCENC_ERR_BAD_PARAM;
  }
  return aVar6;
}

Assistant:

astcenc_error astcenc_decompress_image(
	astcenc_context* ctxo,
	const uint8_t* data,
	size_t data_len,
	astcenc_image* image_outp,
	const astcenc_swizzle* swizzle,
	unsigned int thread_index
) {
	astcenc_error status;
	astcenc_image& image_out = *image_outp;
	astcenc_contexti* ctx = &ctxo->context;

	// Today this doesn't matter (working set on stack) but might in future ...
	if (thread_index >= ctx->thread_count)
	{
		return ASTCENC_ERR_BAD_PARAM;
	}

	status = validate_decompression_swizzle(*swizzle);
	if (status != ASTCENC_SUCCESS)
	{
		return status;
	}

	unsigned int block_x = ctx->config.block_x;
	unsigned int block_y = ctx->config.block_y;
	unsigned int block_z = ctx->config.block_z;

	unsigned int xblocks = (image_out.dim_x + block_x - 1) / block_x;
	unsigned int yblocks = (image_out.dim_y + block_y - 1) / block_y;
	unsigned int zblocks = (image_out.dim_z + block_z - 1) / block_z;
	unsigned int block_count = zblocks * yblocks * xblocks;

	int row_blocks = xblocks;
	int plane_blocks = xblocks * yblocks;

	// Check we have enough output space (16 bytes per block)
	size_t size_needed = xblocks * yblocks * zblocks * 16;
	if (data_len < size_needed)
	{
		return ASTCENC_ERR_OUT_OF_MEM;
	}

	image_block blk {};
	blk.texel_count = static_cast<uint8_t>(block_x * block_y * block_z);

	// Decode mode inferred from the output data type
	blk.decode_unorm8 = image_out.data_type == ASTCENC_TYPE_U8;

	// If context thread count is one then implicitly reset
	if (ctx->thread_count == 1)
	{
		astcenc_decompress_reset(ctxo);
	}

	// Only the first thread actually runs the initializer
	ctxo->manage_decompress.init(block_count, nullptr);

	// All threads run this processing loop until there is no work remaining
	while (true)
	{
		unsigned int count;
		unsigned int base = ctxo->manage_decompress.get_task_assignment(128, count);
		if (!count)
		{
			break;
		}

		for (unsigned int i = base; i < base + count; i++)
		{
			// Decode i into x, y, z block indices
			int z = i / plane_blocks;
			unsigned int rem = i - (z * plane_blocks);
			int y = rem / row_blocks;
			int x = rem - (y * row_blocks);

			unsigned int offset = (((z * yblocks + y) * xblocks) + x) * 16;
			const uint8_t* bp = data + offset;

			symbolic_compressed_block scb;

			physical_to_symbolic(*ctx->bsd, bp, scb);

			decompress_symbolic_block(ctx->config.profile, *ctx->bsd,
			                          x * block_x, y * block_y, z * block_z,
			                          scb, blk);

			store_image_block(image_out, blk, *ctx->bsd,
			                  x * block_x, y * block_y, z * block_z, *swizzle);
		}

		ctxo->manage_decompress.complete_task_assignment(count);
	}

	return ASTCENC_SUCCESS;
}